

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# DeclaredType.cpp
# Opt level: O1

void __thiscall
slang::ast::DeclaredType::mergePortTypes
          (DeclaredType *this,ASTContext *context,ValueSymbol *sourceSymbol,
          ImplicitTypeSyntax *implicit,SourceLocation location,
          span<const_slang::syntax::VariableDimensionSyntax_*const,_18446744073709551615UL>
          unpackedDimensions)

{
  SymbolKind SVar1;
  Scope *pSVar2;
  size_type sVar3;
  bool bVar4;
  bitmask<slang::ast::IntegralFlags> bVar5;
  bitwidth_t width;
  Compilation *pCVar6;
  Compilation *pCVar7;
  Diagnostic *pDVar8;
  _Storage<slang::ConstantRange,_true> _Var9;
  pointer ppVVar10;
  Diagnostic *pDVar11;
  long lVar12;
  pointer ppVVar13;
  VariableDimensionSyntax *this_00;
  ulong uVar14;
  pointer ppVVar15;
  string_view sVar16;
  SourceRange SVar17;
  span<const_slang::ConstantRange,_18446744073709551615UL> dimensions;
  optional<slang::ConstantRange> oVar18;
  Type *destType;
  anon_class_32_4_c3673f5c warnSignedness;
  SmallVector<slang::ConstantRange,_4UL> dims;
  SmallVector<slang::ConstantRange,_4UL> destDims;
  Compilation *local_e8;
  SourceLocation local_e0;
  Token *local_d8;
  DeclaredType *local_d0;
  ConstantRange local_c8;
  anon_class_32_4_c3673f5c local_c0;
  SmallVectorBase<slang::ConstantRange> local_a0;
  SmallVectorBase<slang::ConstantRange> local_68;
  
  local_e0 = location;
  local_d0 = this;
  pCVar6 = (Compilation *)getType(&sourceSymbol->declaredType);
  local_e8 = pCVar6;
  if ((implicit->signing).info == (Info *)0x0) {
LAB_001ee584:
    local_d0->type = (Type *)local_e8;
    if (unpackedDimensions.size_ != 0) {
      ppVVar13 = unpackedDimensions.data_ + unpackedDimensions.size_;
      do {
        pCVar6 = local_e8;
        if ((local_e8->options).topModules.
            super_sherwood_v3_table<std::basic_string_view<char,_std::char_traits<char>_>,_std::basic_string_view<char,_std::char_traits<char>_>,_slang::Hasher<std::basic_string_view<char,_std::char_traits<char>_>_>,_ska::detailv3::functor_storage<unsigned_long,_slang::Hasher<std::basic_string_view<char,_std::char_traits<char>_>_>_>,_std::equal_to<std::basic_string_view<char,_std::char_traits<char>_>_>,_ska::detailv3::functor_storage<bool,_std::equal_to<std::basic_string_view<char,_std::char_traits<char>_>_>_>,_std::allocator<std::basic_string_view<char,_std::char_traits<char>_>_>,_std::allocator<ska::detailv3::sherwood_v3_entry<std::basic_string_view<char,_std::char_traits<char>_>_>_>_>
            .entries == (EntryPointer)0x0) {
          Type::resolveCanonical((Type *)local_e8);
        }
        pCVar7 = local_e8;
        if (*(int *)(pCVar6->options).topModules.
                    super_sherwood_v3_table<std::basic_string_view<char,_std::char_traits<char>_>,_std::basic_string_view<char,_std::char_traits<char>_>,_slang::Hasher<std::basic_string_view<char,_std::char_traits<char>_>_>,_ska::detailv3::functor_storage<unsigned_long,_slang::Hasher<std::basic_string_view<char,_std::char_traits<char>_>_>_>,_std::equal_to<std::basic_string_view<char,_std::char_traits<char>_>_>,_ska::detailv3::functor_storage<bool,_std::equal_to<std::basic_string_view<char,_std::char_traits<char>_>_>_>,_std::allocator<std::basic_string_view<char,_std::char_traits<char>_>_>,_std::allocator<ska::detailv3::sherwood_v3_entry<std::basic_string_view<char,_std::char_traits<char>_>_>_>_>
                    .entries != 0xc) {
          if (unpackedDimensions.data_ != ppVVar13) {
            if ((local_e8->options).topModules.
                super_sherwood_v3_table<std::basic_string_view<char,_std::char_traits<char>_>,_std::basic_string_view<char,_std::char_traits<char>_>,_slang::Hasher<std::basic_string_view<char,_std::char_traits<char>_>_>,_ska::detailv3::functor_storage<unsigned_long,_slang::Hasher<std::basic_string_view<char,_std::char_traits<char>_>_>_>,_std::equal_to<std::basic_string_view<char,_std::char_traits<char>_>_>,_ska::detailv3::functor_storage<bool,_std::equal_to<std::basic_string_view<char,_std::char_traits<char>_>_>_>,_std::allocator<std::basic_string_view<char,_std::char_traits<char>_>_>,_std::allocator<ska::detailv3::sherwood_v3_entry<std::basic_string_view<char,_std::char_traits<char>_>_>_>_>
                .entries == (EntryPointer)0x0) {
              Type::resolveCanonical((Type *)local_e8);
            }
            if (*(int *)(pCVar7->options).topModules.
                        super_sherwood_v3_table<std::basic_string_view<char,_std::char_traits<char>_>,_std::basic_string_view<char,_std::char_traits<char>_>,_slang::Hasher<std::basic_string_view<char,_std::char_traits<char>_>_>,_ska::detailv3::functor_storage<unsigned_long,_slang::Hasher<std::basic_string_view<char,_std::char_traits<char>_>_>_>,_std::equal_to<std::basic_string_view<char,_std::char_traits<char>_>_>,_ska::detailv3::functor_storage<bool,_std::equal_to<std::basic_string_view<char,_std::char_traits<char>_>_>_>,_std::allocator<std::basic_string_view<char,_std::char_traits<char>_>_>,_std::allocator<ska::detailv3::sherwood_v3_entry<std::basic_string_view<char,_std::char_traits<char>_>_>_>_>
                        .entries != 0x22) {
LAB_001ee68e:
              SVar17 = slang::syntax::SyntaxNode::sourceRange
                                 (&(*unpackedDimensions.data_)->super_SyntaxNode);
              pDVar11 = ASTContext::addDiag(context,(DiagCode)0x730006,SVar17);
              Diagnostic::operator<<(pDVar11,(sourceSymbol->super_Symbol).name);
              Diagnostic::addNote(pDVar11,(DiagCode)0x40001,(sourceSymbol->super_Symbol).location);
            }
          }
          break;
        }
        if (unpackedDimensions.data_ == ppVVar13) {
          unpackedDimensions.data_ = ppVVar13 + -1;
          goto LAB_001ee68e;
        }
        oVar18 = ASTContext::evalUnpackedDimension(context,*unpackedDimensions.data_);
        if ((((undefined1  [12])
              oVar18.super__Optional_base<slang::ConstantRange,_true,_true>._M_payload.
              super__Optional_payload_base<slang::ConstantRange> & (undefined1  [12])0x1) ==
             (undefined1  [12])0x0) ||
           (_Var9._M_value = Type::getFixedRange((Type *)local_e8),
           _Var9 != oVar18.super__Optional_base<slang::ConstantRange,_true,_true>._M_payload.
                    super__Optional_payload_base<slang::ConstantRange>._M_payload)) {
          SVar17 = slang::syntax::SyntaxNode::sourceRange
                             (&(*unpackedDimensions.data_)->super_SyntaxNode);
          pDVar11 = ASTContext::addDiag(context,(DiagCode)0x730006,SVar17);
          Diagnostic::operator<<(pDVar11,(sourceSymbol->super_Symbol).name);
          Diagnostic::addNote(pDVar11,(DiagCode)0x40001,(sourceSymbol->super_Symbol).location);
          bVar4 = false;
        }
        else {
          local_e8 = (Compilation *)Type::getArrayElementType((Type *)local_e8);
          unpackedDimensions.data_ = unpackedDimensions.data_ + 1;
          bVar4 = true;
        }
      } while (bVar4);
    }
    if ((implicit->dimensions).
        super_span<slang::syntax::VariableDimensionSyntax_*,_18446744073709551615UL>.size_ != 0) {
      ppVVar15 = (implicit->dimensions).
                 super_span<slang::syntax::VariableDimensionSyntax_*,_18446744073709551615UL>.data_;
      do {
        pCVar6 = local_e8;
        if ((local_e8->options).topModules.
            super_sherwood_v3_table<std::basic_string_view<char,_std::char_traits<char>_>,_std::basic_string_view<char,_std::char_traits<char>_>,_slang::Hasher<std::basic_string_view<char,_std::char_traits<char>_>_>,_ska::detailv3::functor_storage<unsigned_long,_slang::Hasher<std::basic_string_view<char,_std::char_traits<char>_>_>_>,_std::equal_to<std::basic_string_view<char,_std::char_traits<char>_>_>,_ska::detailv3::functor_storage<bool,_std::equal_to<std::basic_string_view<char,_std::char_traits<char>_>_>_>,_std::allocator<std::basic_string_view<char,_std::char_traits<char>_>_>,_std::allocator<ska::detailv3::sherwood_v3_entry<std::basic_string_view<char,_std::char_traits<char>_>_>_>_>
            .entries == (EntryPointer)0x0) {
          Type::resolveCanonical((Type *)local_e8);
        }
        pCVar7 = local_e8;
        sVar3 = (implicit->dimensions).
                super_span<slang::syntax::VariableDimensionSyntax_*,_18446744073709551615UL>.size_;
        ppVVar10 = (implicit->dimensions).
                   super_span<slang::syntax::VariableDimensionSyntax_*,_18446744073709551615UL>.
                   data_ + sVar3;
        if (*(int *)(pCVar6->options).topModules.
                    super_sherwood_v3_table<std::basic_string_view<char,_std::char_traits<char>_>,_std::basic_string_view<char,_std::char_traits<char>_>,_slang::Hasher<std::basic_string_view<char,_std::char_traits<char>_>_>,_ska::detailv3::functor_storage<unsigned_long,_slang::Hasher<std::basic_string_view<char,_std::char_traits<char>_>_>_>,_std::equal_to<std::basic_string_view<char,_std::char_traits<char>_>_>,_ska::detailv3::functor_storage<bool,_std::equal_to<std::basic_string_view<char,_std::char_traits<char>_>_>_>,_std::allocator<std::basic_string_view<char,_std::char_traits<char>_>_>,_std::allocator<ska::detailv3::sherwood_v3_entry<std::basic_string_view<char,_std::char_traits<char>_>_>_>_>
                    .entries != 0xb) {
          if (ppVVar15 == ppVVar10) {
            return;
          }
          if ((local_e8->options).topModules.
              super_sherwood_v3_table<std::basic_string_view<char,_std::char_traits<char>_>,_std::basic_string_view<char,_std::char_traits<char>_>,_slang::Hasher<std::basic_string_view<char,_std::char_traits<char>_>_>,_ska::detailv3::functor_storage<unsigned_long,_slang::Hasher<std::basic_string_view<char,_std::char_traits<char>_>_>_>,_std::equal_to<std::basic_string_view<char,_std::char_traits<char>_>_>,_ska::detailv3::functor_storage<bool,_std::equal_to<std::basic_string_view<char,_std::char_traits<char>_>_>_>,_std::allocator<std::basic_string_view<char,_std::char_traits<char>_>_>,_std::allocator<ska::detailv3::sherwood_v3_entry<std::basic_string_view<char,_std::char_traits<char>_>_>_>_>
              .entries == (EntryPointer)0x0) {
            Type::resolveCanonical((Type *)local_e8);
          }
          if (*(int *)(pCVar7->options).topModules.
                      super_sherwood_v3_table<std::basic_string_view<char,_std::char_traits<char>_>,_std::basic_string_view<char,_std::char_traits<char>_>,_slang::Hasher<std::basic_string_view<char,_std::char_traits<char>_>_>,_ska::detailv3::functor_storage<unsigned_long,_slang::Hasher<std::basic_string_view<char,_std::char_traits<char>_>_>_>,_std::equal_to<std::basic_string_view<char,_std::char_traits<char>_>_>,_ska::detailv3::functor_storage<bool,_std::equal_to<std::basic_string_view<char,_std::char_traits<char>_>_>_>,_std::allocator<std::basic_string_view<char,_std::char_traits<char>_>_>,_std::allocator<ska::detailv3::sherwood_v3_entry<std::basic_string_view<char,_std::char_traits<char>_>_>_>_>
                      .entries == 0x22) {
            return;
          }
          this_00 = *ppVVar15;
LAB_001ee7cb:
          SVar17 = slang::syntax::SyntaxNode::sourceRange(&this_00->super_SyntaxNode);
          pDVar11 = ASTContext::addDiag(context,(DiagCode)0x730006,SVar17);
          Diagnostic::operator<<(pDVar11,(sourceSymbol->super_Symbol).name);
          Diagnostic::addNote(pDVar11,(DiagCode)0x40001,(sourceSymbol->super_Symbol).location);
          return;
        }
        if (ppVVar15 == ppVVar10) {
          if (sVar3 == 0) {
            std::terminate();
          }
          this_00 = ppVVar10[-1];
          goto LAB_001ee7cb;
        }
        oVar18 = ASTContext::evalPackedDimension(context,*ppVVar15);
        if ((((undefined1  [12])
              oVar18.super__Optional_base<slang::ConstantRange,_true,_true>._M_payload.
              super__Optional_payload_base<slang::ConstantRange> & (undefined1  [12])0x1) ==
             (undefined1  [12])0x0) ||
           (_Var9._M_value = Type::getFixedRange((Type *)local_e8),
           _Var9 != oVar18.super__Optional_base<slang::ConstantRange,_true,_true>._M_payload.
                    super__Optional_payload_base<slang::ConstantRange>._M_payload)) {
          SVar17 = slang::syntax::SyntaxNode::sourceRange(&(*ppVVar15)->super_SyntaxNode);
          pDVar11 = ASTContext::addDiag(context,(DiagCode)0x730006,SVar17);
          Diagnostic::operator<<(pDVar11,(sourceSymbol->super_Symbol).name);
          Diagnostic::addNote(pDVar11,(DiagCode)0x40001,(sourceSymbol->super_Symbol).location);
          bVar4 = false;
        }
        else {
          local_e8 = (Compilation *)Type::getArrayElementType((Type *)local_e8);
          ppVVar15 = ppVVar15 + 1;
          bVar4 = true;
        }
      } while (bVar4);
    }
  }
  else {
    local_d8 = &implicit->signing;
    local_68.data_ = (pointer)local_68.firstElement;
    local_68.len = 0;
    local_68.cap = 4;
    while( true ) {
      if ((pCVar6->options).topModules.
          super_sherwood_v3_table<std::basic_string_view<char,_std::char_traits<char>_>,_std::basic_string_view<char,_std::char_traits<char>_>,_slang::Hasher<std::basic_string_view<char,_std::char_traits<char>_>_>,_ska::detailv3::functor_storage<unsigned_long,_slang::Hasher<std::basic_string_view<char,_std::char_traits<char>_>_>_>,_std::equal_to<std::basic_string_view<char,_std::char_traits<char>_>_>,_ska::detailv3::functor_storage<bool,_std::equal_to<std::basic_string_view<char,_std::char_traits<char>_>_>_>,_std::allocator<std::basic_string_view<char,_std::char_traits<char>_>_>,_std::allocator<ska::detailv3::sherwood_v3_entry<std::basic_string_view<char,_std::char_traits<char>_>_>_>_>
          .entries == (EntryPointer)0x0) {
        Type::resolveCanonical((Type *)pCVar6);
      }
      if (*(int *)(pCVar6->options).topModules.
                  super_sherwood_v3_table<std::basic_string_view<char,_std::char_traits<char>_>,_std::basic_string_view<char,_std::char_traits<char>_>,_slang::Hasher<std::basic_string_view<char,_std::char_traits<char>_>_>,_ska::detailv3::functor_storage<unsigned_long,_slang::Hasher<std::basic_string_view<char,_std::char_traits<char>_>_>_>,_std::equal_to<std::basic_string_view<char,_std::char_traits<char>_>_>,_ska::detailv3::functor_storage<bool,_std::equal_to<std::basic_string_view<char,_std::char_traits<char>_>_>_>,_std::allocator<std::basic_string_view<char,_std::char_traits<char>_>_>,_std::allocator<ska::detailv3::sherwood_v3_entry<std::basic_string_view<char,_std::char_traits<char>_>_>_>_>
                  .entries != 0xc) break;
      local_a0.data_ = (pointer)Type::getFixedRange((Type *)pCVar6);
      SmallVectorBase<slang::ConstantRange>::emplace_back<slang::ConstantRange>
                (&local_68,(ConstantRange *)&local_a0);
      pCVar6 = (Compilation *)Type::getArrayElementType((Type *)pCVar6);
    }
    if (*(int *)(pCVar6->options).topModules.
                super_sherwood_v3_table<std::basic_string_view<char,_std::char_traits<char>_>,_std::basic_string_view<char,_std::char_traits<char>_>,_slang::Hasher<std::basic_string_view<char,_std::char_traits<char>_>_>,_ska::detailv3::functor_storage<unsigned_long,_slang::Hasher<std::basic_string_view<char,_std::char_traits<char>_>_>_>,_std::equal_to<std::basic_string_view<char,_std::char_traits<char>_>_>,_ska::detailv3::functor_storage<bool,_std::equal_to<std::basic_string_view<char,_std::char_traits<char>_>_>_>,_std::allocator<std::basic_string_view<char,_std::char_traits<char>_>_>,_std::allocator<ska::detailv3::sherwood_v3_entry<std::basic_string_view<char,_std::char_traits<char>_>_>_>_>
                .entries != 0x22) {
      bVar4 = Type::isIntegral((Type *)pCVar6);
      if (bVar4) {
        local_c0.context = context;
        local_c0.implicit = implicit;
        local_c0.sourceSymbol = sourceSymbol;
        if ((implicit->signing).kind == SignedKeyword) {
          local_c0.destType = (Type **)&local_e8;
          bVar4 = Type::isSigned((Type *)pCVar6);
          if (!bVar4) {
            pSVar2 = (context->scope).ptr;
            if (pSVar2 == (Scope *)0x0) {
LAB_001ee83d:
              assert::assertFailed
                        ("ptr",
                         "/workspace/llm4binary/github/license_all_cmakelists_25/Kuree[P]hgdb-rtl/extern/slang/source/../include/slang/util/NotNull.h"
                         ,0x26,
                         "T slang::not_null<const slang::ast::Scope *>::get() const [T = const slang::ast::Scope *]"
                        );
            }
            local_e0 = (SourceLocation)pSVar2->compilation;
            local_a0.data_ = (pointer)local_a0.firstElement;
            local_a0.len = 0;
            local_a0.cap = 4;
            for (pCVar7 = pCVar6; SVar1 = ((Symbol *)&pCVar7->super_BumpAllocator)->kind,
                SVar1 == PackedArrayType;
                pCVar7 = (Compilation *)Type::getArrayElementType((Type *)pCVar7)) {
              local_c8 = Type::getFixedRange((Type *)pCVar7);
              SmallVectorBase<slang::ConstantRange>::emplace_back<slang::ConstantRange>
                        (&local_a0,&local_c8);
            }
            if (SVar1 == ScalarType) {
              bVar5 = Type::getIntegralFlags((Type *)pCVar7);
              if (local_a0.len == 1) {
                width = Type::getBitWidth((Type *)pCVar6);
                pCVar6 = (Compilation *)
                         Compilation::getType
                                   ((Compilation *)local_e0,width,
                                    (bitmask<slang::ast::IntegralFlags>)(bVar5.m_bits | 1));
              }
              else {
                pCVar6 = (Compilation *)
                         Compilation::getScalarType
                                   ((Compilation *)local_e0,
                                    (bitmask<slang::ast::IntegralFlags>)(bVar5.m_bits | 1));
                if (local_a0.len != 0) {
                  lVar12 = local_a0.len * 8;
                  uVar14 = local_a0.len;
                  do {
                    uVar14 = uVar14 - 1;
                    lVar12 = lVar12 + -8;
                    if (local_a0.len <= uVar14) {
                      assert::assertFailed
                                ("index < len",
                                 "/workspace/llm4binary/github/license_all_cmakelists_25/Kuree[P]hgdb-rtl/extern/slang/source/../include/slang/util/SmallVector.h"
                                 ,0x196,
                                 "reference slang::SmallVectorBase<slang::ConstantRange>::operator[](size_type) [T = slang::ConstantRange]"
                                );
                    }
                    pCVar6 = (Compilation *)
                             BumpAllocator::
                             emplace<slang::ast::PackedArrayType,slang::ast::Type_const&,slang::ConstantRange&>
                                       ((BumpAllocator *)local_e0,(Type *)pCVar6,
                                        (ConstantRange *)((long)local_a0.data_ + lVar12));
                  } while (uVar14 != 0);
                }
              }
            }
            if (local_a0.data_ != (pointer)local_a0.firstElement) {
              free(local_a0.data_);
            }
            bVar4 = Type::isSigned((Type *)pCVar6);
            if (bVar4) {
              pSVar2 = (context->scope).ptr;
              if (pSVar2 == (Scope *)0x0) goto LAB_001ee83d;
              dimensions.size_ = (size_type)location;
              dimensions.data_ = (pointer)local_68.len;
              local_e8 = (Compilation *)
                         FixedSizeUnpackedArrayType::fromDims
                                   ((FixedSizeUnpackedArrayType *)pSVar2->compilation,pCVar6,
                                    (Type *)local_68.data_,dimensions);
            }
            else {
              mergePortTypes::anon_class_32_4_c3673f5c::operator()(&local_c0);
            }
          }
        }
        else {
          local_c0.destType = (Type **)&local_e8;
          bVar4 = Type::isSigned((Type *)pCVar6);
          if (bVar4) {
            SVar17 = parsing::Token::range(local_d8);
            pDVar11 = ASTContext::addDiag(context,(DiagCode)0xb20006,SVar17);
            sVar16 = parsing::Token::valueText(local_d8);
            pDVar8 = Diagnostic::operator<<(pDVar11,sVar16);
            ast::operator<<(pDVar8,*local_c0.destType);
            Diagnostic::addNote(pDVar11,(DiagCode)0x40001,
                                ((local_c0.sourceSymbol)->super_Symbol).location);
          }
        }
        if (local_68.data_ != (pointer)local_68.firstElement) {
          free(local_68.data_);
        }
        goto LAB_001ee584;
      }
      if (((sourceSymbol->super_Symbol).kind == Net) &&
         (*(int *)(*(long *)&sourceSymbol[1].super_Symbol + 0x80) == 0xd)) {
        SVar17 = parsing::Token::range(local_d8);
        pDVar11 = ASTContext::addDiag(context,(DiagCode)0x510005,SVar17);
        Diagnostic::addNote(pDVar11,(DiagCode)0x40001,(sourceSymbol->super_Symbol).location);
      }
      else {
        pDVar11 = ASTContext::addDiag(context,(DiagCode)0xc0006,local_e0);
        pDVar8 = Diagnostic::operator<<(pDVar11,(sourceSymbol->super_Symbol).name);
        sVar16 = parsing::Token::valueText(local_d8);
        pDVar8 = Diagnostic::operator<<(pDVar8,sVar16);
        ast::operator<<(pDVar8,(Type *)local_e8);
        Diagnostic::addNote(pDVar11,(DiagCode)0x40001,(sourceSymbol->super_Symbol).location);
      }
    }
    if (local_68.data_ != (pointer)local_68.firstElement) {
      free(local_68.data_);
    }
  }
  return;
}

Assistant:

void DeclaredType::mergePortTypes(
    const ASTContext& context, const ValueSymbol& sourceSymbol, const ImplicitTypeSyntax& implicit,
    SourceLocation location, span<const VariableDimensionSyntax* const> unpackedDimensions) const {

    // There's this really terrible "feature" where the port declaration can influence the type
    // of the actual symbol somewhere else in the tree. This is ugly but should be safe since
    // nobody else can look at that symbol's type until we've gone through elaboration.
    //
    // In this context, the sourceSymbol is the actual variable declaration with, presumably,
    // a full type declared. The implicit syntax is from the port I/O declaration, which needs
    // to be merged. For example:
    //
    //   input signed [1:0] foo;    // implicit + unpackedDimensions + location
    //   logic foo;                 // sourceSymbol
    const Type* destType = &sourceSymbol.getType();

    if (implicit.signing) {
        // Drill past any unpacked arrays to figure out if this thing is even integral.
        SmallVector<ConstantRange, 4> destDims;
        const Type* sourceType = destType;
        while (sourceType->getCanonicalType().kind == SymbolKind::FixedSizeUnpackedArrayType) {
            destDims.push_back(sourceType->getFixedRange());
            sourceType = sourceType->getArrayElementType();
        }

        if (sourceType->isError())
            return;

        if (!sourceType->isIntegral()) {
            if (sourceSymbol.kind == SymbolKind::Net &&
                sourceSymbol.as<NetSymbol>().netType.netKind == NetType::Interconnect) {
                auto& diag = context.addDiag(diag::InterconnectTypeSyntax,
                                             implicit.signing.range());
                diag.addNote(diag::NoteDeclarationHere, sourceSymbol.location);
            }
            else {
                auto& diag = context.addDiag(diag::CantDeclarePortSigned, location);
                diag << sourceSymbol.name << implicit.signing.valueText() << *destType;
                diag.addNote(diag::NoteDeclarationHere, sourceSymbol.location);
            }
            return;
        }

        auto warnSignedness = [&] {
            auto& diag = context.addDiag(diag::SignednessNoEffect, implicit.signing.range());
            diag << implicit.signing.valueText() << *destType;
            diag.addNote(diag::NoteDeclarationHere, sourceSymbol.location);
        };

        bool shouldBeSigned = implicit.signing.kind == TokenKind::SignedKeyword;
        if (shouldBeSigned && !sourceType->isSigned()) {
            sourceType = makeSigned(context.getCompilation(), *sourceType);
            if (!sourceType->isSigned()) {
                warnSignedness();
            }
            else {
                // Put the unpacked dimensions back on the type now that it
                // has been made signed.
                destType = &FixedSizeUnpackedArrayType::fromDims(context.getCompilation(),
                                                                 *sourceType, destDims);
            }
        }
        else if (!shouldBeSigned && sourceType->isSigned()) {
            warnSignedness();
        }
    }

    // Our declared type takes on the merged type from the variable definition.
    this->type = destType;

    auto errorDims = [&](auto& dims) {
        auto& diag = context.addDiag(diag::PortDeclDimensionsMismatch, dims.sourceRange());
        diag << sourceSymbol.name;
        diag.addNote(diag::NoteDeclarationHere, sourceSymbol.location);
    };

    auto checkDims = [&](auto& dims, SymbolKind arrayKind, bool isPacked) {
        if (!dims.empty()) {
            auto it = dims.begin();
            while (destType->getCanonicalType().kind == arrayKind) {
                if (it == dims.end()) {
                    errorDims(*dims.back());
                    return;
                }

                auto dim = isPacked ? context.evalPackedDimension(**it)
                                    : context.evalUnpackedDimension(**it);
                if (!dim || destType->getFixedRange() != *dim) {
                    errorDims(**it);
                    return;
                }

                destType = destType->getArrayElementType();
                it++;
            }

            if (it != dims.end() && !destType->isError()) {
                errorDims(**it);
                return;
            }
        }
    };

    // Unpacked dim checks have to come first because it unwraps the destType
    // for the packed one to look at.
    checkDims(unpackedDimensions, SymbolKind::FixedSizeUnpackedArrayType, false);
    checkDims(implicit.dimensions, SymbolKind::PackedArrayType, true);
}